

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::trapIfGt
          (ModuleRunnerBase<wasm::ModuleRunner> *this,uint64_t lhs,uint64_t rhs,char *msg)

{
  ExternalInterface *pEVar1;
  ostream *poVar2;
  undefined8 uVar3;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  char *local_28;
  char *msg_local;
  uint64_t rhs_local;
  uint64_t lhs_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  if (rhs < lhs) {
    local_28 = msg;
    msg_local = (char *)rhs;
    rhs_local = lhs;
    lhs_local = (uint64_t)this;
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,local_28);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,rhs_local);
    poVar2 = std::operator<<(poVar2," > ");
    std::ostream::operator<<(poVar2,(ulong)msg_local);
    pEVar1 = this->externalInterface;
    std::__cxx11::stringstream::str();
    uVar3 = std::__cxx11::string::c_str();
    (*pEVar1->_vptr_ExternalInterface[8])(pEVar1,uVar3);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return;
}

Assistant:

void trapIfGt(uint64_t lhs, uint64_t rhs, const char* msg) {
    if (lhs > rhs) {
      std::stringstream ss;
      ss << msg << ": " << lhs << " > " << rhs;
      externalInterface->trap(ss.str().c_str());
    }
  }